

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::UniqueNameGenerator(UniqueNameGenerator *this)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"unnamed",&local_11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->separator_,"_",&local_12);
  return;
}

Assistant:

UniqueNameGenerator::UniqueNameGenerator() :
    template_name_("unnamed"),
    separator_("_") {
}